

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_objects.cpp
# Opt level: O0

void __thiscall
ear::GainCalculatorObjectsImpl::calculate
          (GainCalculatorObjectsImpl *this,ObjectsTypeMetadata *metadata,OutputGains *direct,
          OutputGains *diffuse,WarningCB *param_4)

{
  Index *this_00;
  _func_int **width;
  _func_int **height;
  _func_int **depth;
  PolarPosition position_00;
  undefined8 uVar1;
  undefined8 uVar2;
  WarningCB *this_01;
  OutputGains *this_02;
  not_implemented *pnVar3;
  size_type sVar4;
  type pPVar5;
  Index size;
  double in_stack_fffffffffffffd70;
  double local_1e0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_1d8;
  double local_1b0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_1a8;
  BooleanNotReturnType local_180;
  ConstantReturnType local_170;
  undefined1 local_158 [8];
  VectorXd pv_full;
  Matrix<double,_3,_1,_0,_3,_1> local_130;
  double local_118;
  double dStack_110;
  double local_108;
  undefined1 local_f8 [8];
  Vector3d position;
  string local_d8;
  undefined1 local_b2;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_8a;
  allocator<char> local_89;
  string local_88;
  throw_if_not_implemented local_67;
  throw_if_not_implemented local_66;
  undefined1 local_65;
  allocator<char> local_51;
  string local_50;
  WarningCB *local_30;
  WarningCB *param_4_local;
  OutputGains *diffuse_local;
  OutputGains *direct_local;
  ObjectsTypeMetadata *metadata_local;
  GainCalculatorObjectsImpl *this_local;
  
  local_30 = param_4;
  param_4_local = (WarningCB *)diffuse;
  diffuse_local = direct;
  direct_local = (OutputGains *)metadata;
  metadata_local = (ObjectsTypeMetadata *)this;
  if ((metadata->cartesian & 1U) != 0) {
    local_65 = 1;
    pnVar3 = (not_implemented *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"cartesian",&local_51);
    not_implemented::not_implemented(pnVar3,&local_50);
    local_65 = 0;
    __cxa_throw(pnVar3,&not_implemented::typeinfo,not_implemented::~not_implemented);
  }
  boost::
  apply_visitor<ear::throw_if_not_implemented,boost::variant<ear::CartesianPosition,ear::PolarPosition>const&>
            (&local_66,&metadata->position);
  boost::
  apply_visitor<ear::throw_if_not_implemented,boost::variant<ear::PolarObjectDivergence,ear::CartesianObjectDivergence>const&>
            (&local_67,
             (variant<ear::PolarObjectDivergence,_ear::CartesianObjectDivergence> *)
             (direct_local + 0xd));
  if (((ulong)direct_local[10]._vptr_OutputGains & 1) != 0) {
    local_8a = 1;
    pnVar3 = (not_implemented *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"channelLock",&local_89);
    not_implemented::not_implemented(pnVar3,&local_88);
    local_8a = 0;
    __cxa_throw(pnVar3,&not_implemented::typeinfo,not_implemented::~not_implemented);
  }
  sVar4 = std::
          vector<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>,_std::allocator<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>_>_>
          ::size((vector<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>,_std::allocator<boost::variant<ear::PolarExclusionZone,_ear::CartesianExclusionZone>_>_>
                  *)(direct_local + 0x10));
  if (sVar4 != 0) {
    local_b2 = 1;
    pnVar3 = (not_implemented *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"zoneExclusion",&local_b1);
    not_implemented::not_implemented(pnVar3,&local_b0);
    local_b2 = 0;
    __cxa_throw(pnVar3,&not_implemented::typeinfo,not_implemented::~not_implemented);
  }
  if (((ulong)direct_local[0x13]._vptr_OutputGains & 1) != 0) {
    position.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
    _6_1_ = 1;
    pnVar3 = (not_implemented *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"screenRef",
               (allocator<char> *)
               ((long)position.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + 0x17));
    not_implemented::not_implemented(pnVar3,&local_d8);
    position.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2].
    _6_1_ = 0;
    __cxa_throw(pnVar3,&not_implemented::typeinfo,not_implemented::~not_implemented);
  }
  pPVar5 = boost::get<ear::PolarPosition,ear::CartesianPosition,ear::PolarPosition>
                     ((variant<ear::CartesianPosition,_ear::PolarPosition> *)direct_local);
  local_108 = pPVar5->distance;
  local_118 = pPVar5->azimuth;
  dStack_110 = pPVar5->elevation;
  uVar1 = pPVar5->elevation;
  uVar2 = pPVar5->distance;
  position_00.elevation = (double)uVar2;
  position_00.azimuth = (double)uVar1;
  position_00.distance = in_stack_fffffffffffffd70;
  toCartesianVector3d(position_00);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_130,(Matrix<double,_3,_1,_0,_3,_1> *)local_f8)
  ;
  width = direct_local[4]._vptr_OutputGains;
  height = direct_local[5]._vptr_OutputGains;
  depth = direct_local[6]._vptr_OutputGains;
  this_00 = &pv_full.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)this_00,
             &(this->_pvTmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (type *)0x0);
  PolarExtent::handle(&this->_polarExtentPanner,&local_130,(double)width,(double)height,
                      (double)depth,
                      (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                      this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->_pvTmp,
             (Scalar *)(direct_local + 8));
  size = Eigen::EigenBase<Eigen::Array<bool,_-1,_1,_0,_-1,_1>_>::size
                   ((EigenBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_> *)&this->_isLfe);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_170,size);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_158,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_170);
  Eigen::ArrayBase<Eigen::Array<bool,_-1,_1,_0,_-1,_1>_>::operator!
            (&local_180,(ArrayBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_> *)&this->_isLfe);
  mask_write<Eigen::Matrix<double,_1,1,0,_1,1>&,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_158,&local_180,&this->_pvTmp);
  this_02 = diffuse_local;
  local_1b0 = sqrt(1.0 - (double)direct_local[9]._vptr_OutputGains);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            (&local_1a8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_158,&local_1b0);
  OutputGains::
  write_vector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (this_02,&local_1a8);
  this_01 = param_4_local;
  local_1e0 = sqrt((double)direct_local[9]._vptr_OutputGains);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            (&local_1d8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_158,&local_1e0);
  OutputGains::
  write_vector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((OutputGains *)this_01,&local_1d8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_158);
  return;
}

Assistant:

void GainCalculatorObjectsImpl::calculate(const ObjectsTypeMetadata& metadata,
                                            OutputGains& direct,
                                            OutputGains& diffuse,
                                            const WarningCB&) {
    if (metadata.cartesian) throw not_implemented("cartesian");
    boost::apply_visitor(throw_if_not_implemented(), metadata.position);
    boost::apply_visitor(throw_if_not_implemented(), metadata.objectDivergence);
    if (metadata.channelLock.flag) throw not_implemented("channelLock");
    if (metadata.zoneExclusion.zones.size())
      throw not_implemented("zoneExclusion");
    if (metadata.screenRef) throw not_implemented("screenRef");

    Eigen::Vector3d position =
        toCartesianVector3d(boost::get<PolarPosition>(metadata.position));
    _polarExtentPanner.handle(position, metadata.width, metadata.height,
                              metadata.depth, _pvTmp);
    _pvTmp *= metadata.gain;

    Eigen::VectorXd pv_full = Eigen::VectorXd::Zero(_isLfe.size());
    mask_write(pv_full, !_isLfe, _pvTmp);

    // apply diffuse split
    direct.write_vector(pv_full * std::sqrt(1.0 - metadata.diffuse));
    diffuse.write_vector(pv_full * std::sqrt(metadata.diffuse));
  }